

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cli.c
# Opt level: O2

cf_void_t cfx_cli_cmd_add_sub(cfx_cli_cmd_t *parent,cfx_cli_cmd_t *subcmd)

{
  cfx_cli_cmd_t *pcVar1;
  cfx_cli_cmd_t *pcVar2;
  
  pcVar1 = parent->child;
  if (parent->child != (cfx_cli_cmd_t *)0x0) {
    do {
      pcVar2 = pcVar1;
      pcVar1 = pcVar2->next;
    } while (pcVar2->next != (cfx_cli_cmd_t *)0x0);
    subcmd->prev = pcVar2;
    subcmd->next = (cfx_cli_cmd_t *)0x0;
    pcVar2->next = subcmd;
    return;
  }
  parent->child = subcmd;
  subcmd->prev = (cfx_cli_cmd_t *)0x0;
  subcmd->next = (cfx_cli_cmd_t *)0x0;
  return;
}

Assistant:

cf_void_t cfx_cli_cmd_add_sub(cfx_cli_cmd_t* parent, cfx_cli_cmd_t* subcmd) {
    cfx_cli_cmd_t* p;

    if (!parent->child) {
        parent->child = subcmd;
        parent->child->prev = CF_NULL_PTR;
        parent->child->next = CF_NULL_PTR;
    }
    else {
        p = parent->child;
        while (p->next) {
             p= p->next;
        }
        subcmd->prev = p;
        subcmd->next = CF_NULL_PTR;
        p->next = subcmd;
    }
}